

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<int>::CopyFrom(RepeatedField<int> *this,RepeatedField<int> *other)

{
  if (other != this) {
    this->current_size_ = 0;
    MergeFrom(this,other);
    return;
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::CopyFrom(const RepeatedField& other) {
  if (&other == this) return;
  Clear();
  MergeFrom(other);
}